

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

int xmlNodeBufGetContent(xmlBufferPtr buffer,xmlNode *cur)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  xmlBufPtr buf;
  
  iVar3 = -1;
  if (buffer != (xmlBufferPtr)0x0 && cur != (xmlNode *)0x0) {
    buf = xmlBufFromBuffer(buffer);
    uVar1 = xmlBufGetNodeContent(buf,cur);
    uVar2 = xmlBufBackToBuffer(buf,buffer);
    iVar3 = (int)(uVar2 | uVar1) >> 0x1f;
  }
  return iVar3;
}

Assistant:

int
xmlNodeBufGetContent(xmlBufferPtr buffer, const xmlNode *cur)
{
    xmlBufPtr buf;
    int ret1, ret2;

    if ((cur == NULL) || (buffer == NULL)) return(-1);
    buf = xmlBufFromBuffer(buffer);
    ret1 = xmlBufGetNodeContent(buf, cur);
    ret2 = xmlBufBackToBuffer(buf, buffer);
    if ((ret1 < 0) || (ret2 < 0))
        return(-1);
    return(0);
}